

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

ssize_t __thiscall
libtorrent::aux::udp_socket::read(udp_socket *this,int __fd,void *__buf,size_t __nbytes)

{
  udp_socket *sender_endpoint;
  undefined8 *puVar1;
  size_t *psVar2;
  int iVar3;
  element_type *peVar4;
  undefined8 uVar5;
  bool bVar6;
  byte bVar7;
  size_t sVar8;
  long lVar9;
  undefined4 in_register_00000034;
  long lVar10;
  udp_socket *this_00;
  char cVar11;
  uint uVar12;
  int num;
  uint local_bc;
  int local_b0;
  data_union local_a8;
  undefined1 local_88 [48];
  size_t local_58;
  undefined5 uStack_50;
  undefined3 uStack_4b;
  error_code eStack_48;
  
  lVar10 = CONCAT44(in_register_00000034,__fd);
  sender_endpoint = (udp_socket *)(local_88 + 0x10);
  local_88._24_4_ = 0;
  local_88._28_4_ = 0;
  local_88._32_4_ = 0;
  local_88._36_8_ = 0;
  local_88._0_8_ = (array<char,_1500UL> *)0x0;
  local_88._8_8_ = 0;
  local_88._16_8_ = 2;
  local_58 = 0;
  uStack_50 = 0;
  uStack_4b = 0;
  eStack_48.val_ = 0;
  eStack_48.failed_ = false;
  eStack_48.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  uVar12 = 0;
  do {
    local_b0 = (int)__buf;
    if (local_b0 <= (int)uVar12) goto LAB_003839f6;
    local_a8._0_8_ =
         (this->m_buf)._M_t.
         super___uniq_ptr_impl<std::array<char,_1500UL>,_std::default_delete<std::array<char,_1500UL>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::array<char,_1500UL>_*,_std::default_delete<std::array<char,_1500UL>_>_>
         .super__Head_base<0UL,_std::array<char,_1500UL>_*,_false>._M_head_impl;
    local_a8._8_4_ = 0x5dc;
    local_a8._12_4_ = 0;
    sVar8 = boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::
            receive_from<boost::asio::mutable_buffer>
                      ((this->m_socket).
                       super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .
                       super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .impl_.service_,
                       &(this->m_socket).
                        super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        .
                        super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                        .impl_.implementation_,(mutable_buffer *)&local_a8.base,
                       (endpoint_type *)sender_endpoint,0,(error_code *)__nbytes);
    iVar3 = *(int *)__nbytes;
    if ((iVar3 == 0xb) &&
       ((*(long *)(*(long *)(__nbytes + 8) + 8) == -0x70502de1da3a1f65 ||
        (*(long *)(*(long *)(__nbytes + 8) + 8) == -0x70502de1da3a1f65)))) goto LAB_003838a8;
    if (iVar3 == 4) {
      cVar11 = '\x02';
      if (*(long *)(*(long *)(__nbytes + 8) + 8) != -0x70502de1da3a1f65) goto LAB_003838d5;
      goto LAB_003839e2;
    }
    if (iVar3 == 9) {
      if (*(long *)(*(long *)(__nbytes + 8) + 8) != -0x70502de1da3a1f65) goto LAB_003838d5;
LAB_003838a8:
      cVar11 = '\x01';
      local_bc = uVar12;
    }
    else {
      if ((iVar3 == 0x7d) && (*(long *)(*(long *)(__nbytes + 8) + 8) == -0x70502de1da3a1f65))
      goto LAB_003838a8;
LAB_003838d5:
      if (*(char *)(__nbytes + 4) == '\x01') {
        cVar11 = '\x02';
        if ((this->m_proxy_settings).type == none) {
          eStack_48.cat_ = *(error_category **)(__nbytes + 8);
          eStack_48._0_5_ = SUB85(*(undefined8 *)__nbytes,0);
          eStack_48._5_3_ = SUB83((ulong)*(undefined8 *)__nbytes >> 0x28,0);
          local_88._0_8_ = (array<char,_1500UL> *)0x0;
          local_88._8_8_ = 0;
          goto LAB_00383998;
        }
      }
      else {
        local_88._0_8_ =
             (this->m_buf)._M_t.
             super___uniq_ptr_impl<std::array<char,_1500UL>,_std::default_delete<std::array<char,_1500UL>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::array<char,_1500UL>_*,_std::default_delete<std::array<char,_1500UL>_>_>
             .super__Head_base<0UL,_std::array<char,_1500UL>_*,_false>._M_head_impl;
        local_88._8_8_ = SEXT48((int)sVar8);
        peVar4 = (this->m_socks5_connection).
                 super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 == (element_type *)0x0) || (peVar4->m_active != true)) {
          bVar7 = (this->m_proxy_settings).proxy_tracker_connections &
                  (this->m_proxy_settings).proxy_peer_connections &
                  (this->m_proxy_settings).type != none;
          if (bVar7 == 0) goto LAB_00383998;
          cVar11 = bVar7 * '\x02';
        }
        else {
          local_a8._0_8_ = *(undefined8 *)&(peVar4->m_udp_proxy_addr).impl_.data_;
          uVar5 = *(undefined8 *)((long)&(peVar4->m_udp_proxy_addr).impl_.data_ + 8);
          local_a8._20_8_ = *(undefined8 *)((long)&(peVar4->m_udp_proxy_addr).impl_.data_ + 0x14);
          local_a8._16_4_ =
               (undefined4)
               ((ulong)*(undefined8 *)((long)&(peVar4->m_udp_proxy_addr).impl_.data_ + 0xc) >> 0x20)
          ;
          local_a8._8_4_ = (undefined4)uVar5;
          local_a8._12_4_ = (undefined4)((ulong)uVar5 >> 0x20);
          this_00 = sender_endpoint;
          bVar6 = boost::asio::ip::operator==
                            ((basic_endpoint<boost::asio::ip::udp> *)sender_endpoint,
                             (basic_endpoint<boost::asio::ip::udp> *)&local_a8.base);
          cVar11 = '\x02';
          if ((bVar6) && (bVar6 = unwrap(this_00,(packet *)local_88), bVar6)) {
LAB_00383998:
            lVar9 = (long)(int)uVar12 * 0x50;
            *(undefined8 *)(lVar10 + lVar9) = local_88._0_8_;
            ((undefined8 *)(lVar10 + lVar9))[1] = local_88._8_8_;
            puVar1 = (undefined8 *)(lVar10 + 0x10 + lVar9);
            *puVar1 = local_88._16_8_;
            puVar1[1] = CONCAT44(local_88._28_4_,local_88._24_4_);
            puVar1 = (undefined8 *)(lVar10 + 0x1c + lVar9);
            *puVar1 = CONCAT44(local_88._32_4_,local_88._28_4_);
            puVar1[1] = local_88._36_8_;
            psVar2 = (size_t *)(lVar10 + 0x30 + lVar9);
            *psVar2 = local_58;
            psVar2[1] = CONCAT35(uStack_4b,uStack_50);
            puVar1 = (undefined8 *)(lVar10 + 0x40 + lVar9);
            *puVar1 = CONCAT35(eStack_48._5_3_,eStack_48._0_5_);
            puVar1[1] = eStack_48.cat_;
            uVar12 = uVar12 + 1;
            cVar11 = '\x03';
          }
        }
      }
    }
LAB_003839e2:
  } while (cVar11 == '\x02');
  if (cVar11 == '\x03') {
LAB_003839f6:
    local_bc = uVar12;
  }
  return (ulong)local_bc;
}

Assistant:

int udp_socket::read(span<packet> pkts, error_code& ec)
{
	auto const num = int(pkts.size());
	int ret = 0;
	packet p;

	while (ret < num)
	{
		int const len = int(m_socket.receive_from(boost::asio::buffer(*m_buf)
			, p.from, 0, ec));

		if (ec == error::would_block
			|| ec == error::try_again
			|| ec == error::operation_aborted
			|| ec == error::bad_descriptor)
		{
			return ret;
		}

		if (ec == error::interrupted)
		{
			continue;
		}

		if (ec)
		{
			// SOCKS5 cannot wrap ICMP errors. And even if it could, they certainly
			// would not arrive as unwrapped (regular) ICMP errors. If we're using
			// a proxy we must ignore these
			if (m_proxy_settings.type != settings_pack::none) continue;

			p.error = ec;
			p.data = span<char>();
		}
		else
		{
			p.data = {m_buf->data(), len};

			// support packets coming from the SOCKS5 proxy
			if (active_socks5())
			{
				// if the source IP doesn't match the proxy's, ignore the packet
				if (p.from != m_socks5_connection->target()) continue;
				// if we failed to unwrap, silently ignore the packet
				if (!unwrap(p)) continue;
			}
			else
			{
				// if we don't proxy trackers or peers, we may be receiving unwrapped
				// packets and we must let them through.
				bool const proxy_only
					= m_proxy_settings.proxy_peer_connections
					&& m_proxy_settings.proxy_tracker_connections
					;

				// if we proxy everything, block all packets that aren't coming from
				// the proxy
				if (m_proxy_settings.type != settings_pack::none && proxy_only) continue;
			}
		}

		pkts[ret] = p;
		++ret;

		// we only have a single buffer for now, so we can only return a
		// single packet. In the future though, we could attempt to drain
		// the socket here, or maybe even use recvmmsg()
		break;
	}

	return ret;
}